

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

container_t *
container_from_run_range(run_container_t *run,uint32_t min,uint32_t max,uint8_t *typecode_after)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  ulong uVar4;
  array_container_t *bits;
  array_container_t *paVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint64_t *puVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  
  bits = (array_container_t *)bitset_container_create();
  *typecode_after = '\x01';
  iVar13 = run->n_runs;
  if ((long)iVar13 < 1) {
    puVar12 = (uint64_t *)bits->array;
    iVar9 = 0;
  }
  else {
    prVar3 = run->runs;
    puVar12 = (uint64_t *)bits->array;
    lVar16 = 0;
    iVar9 = 0;
    do {
      uVar1 = prVar3[lVar16].value;
      uVar2 = prVar3[lVar16].length;
      uVar10 = (uint)(uVar1 >> 6);
      uVar11 = (uint)uVar1 + (uint)uVar2 >> 6;
      if (uVar11 - uVar10 == 0) {
        puVar12[uVar10] =
             puVar12[uVar10] |
             (0xffffffffffffffffU >> (0x3fU - (char)uVar2 & 0x3f)) << ((byte)uVar1 & 0x3f);
      }
      else {
        uVar4 = puVar12[uVar11];
        puVar12[uVar10] = puVar12[uVar10] | -1L << ((byte)uVar1 & 0x3f);
        if (uVar10 + 1 < uVar11) {
          memset(puVar12 + (ulong)(uVar1 >> 6) + 1,0xff,
                 (ulong)((uVar11 - uVar10) - 2 >> 1) * 0x10 + 0x10);
        }
        puVar12[uVar11] = uVar4 | 0xffffffffffffffffU >> (~(byte)((uint)uVar1 + (uint)uVar2) & 0x3f)
        ;
      }
      iVar9 = iVar9 + (uint)uVar2 + 1;
      lVar16 = lVar16 + 1;
    } while (iVar13 != lVar16);
  }
  uVar10 = min >> 6;
  uVar11 = max >> 6;
  uVar4 = puVar12[uVar10];
  if (uVar11 == uVar10) {
    uVar8 = (0xffffffffffffffffU >> (0x3fU - (char)(max - min) & 0x3f)) << ((byte)min & 0x3f);
    uVar7 = uVar4 & uVar8;
    uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
    uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
    uVar15 = (uint)(byte)(((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    puVar12[uVar10] = uVar8 | uVar4;
  }
  else {
    uVar8 = -1L << ((byte)min & 0x3f);
    uVar7 = uVar4 & uVar8;
    uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
    uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
    uVar7 = ((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
    uVar17 = uVar7 >> 0x38;
    uVar15 = (uint)(byte)(uVar7 >> 0x38);
    uVar6 = uVar10 + 1;
    if (uVar6 < uVar11) {
      uVar7 = (ulong)uVar6;
      do {
        uVar14 = puVar12[uVar7] - (puVar12[uVar7] >> 1 & 0x5555555555555555);
        uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
        uVar15 = (int)uVar17 +
                 (uint)(byte)(((uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                             0x38);
        uVar17 = (ulong)uVar15;
        uVar7 = uVar7 + 1;
      } while (uVar11 != uVar7);
    }
    uVar7 = puVar12[uVar11];
    uVar14 = 0xffffffffffffffff >> (~(byte)max & 0x3f);
    uVar17 = uVar7 & uVar14;
    uVar17 = uVar17 - (uVar17 >> 1 & 0x5555555555555555);
    uVar17 = (uVar17 >> 2 & 0x3333333333333333) + (uVar17 & 0x3333333333333333);
    puVar12[uVar10] = uVar4 | uVar8;
    if (uVar6 < uVar11) {
      memset(puVar12 + (ulong)uVar10 + 1,0xff,(ulong)((uVar11 - uVar10) - 2 >> 1) * 0x10 + 0x10);
    }
    uVar15 = uVar15 + (byte)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38);
    puVar12[uVar11] = uVar7 | uVar14;
  }
  iVar13 = ((max - min) + iVar9 + 1) - uVar15;
  bits->cardinality = iVar13;
  if (iVar13 < 0x1001) {
    paVar5 = array_container_from_bitset((bitset_container_t *)bits);
    *typecode_after = '\x02';
    bitset_container_free((bitset_container_t *)bits);
    bits = paVar5;
  }
  return bits;
}

Assistant:

container_t *container_from_run_range(const run_container_t *run, uint32_t min,
                                      uint32_t max, uint8_t *typecode_after) {
    // We expect most of the time to end up with a bitset container
    bitset_container_t *bitset = bitset_container_create();
    *typecode_after = BITSET_CONTAINER_TYPE;
    int32_t union_cardinality = 0;
    for (int32_t i = 0; i < run->n_runs; ++i) {
        uint32_t rle_min = run->runs[i].value;
        uint32_t rle_max = rle_min + run->runs[i].length;
        bitset_set_lenrange(bitset->words, rle_min, rle_max - rle_min);
        union_cardinality += run->runs[i].length + 1;
    }
    union_cardinality += max - min + 1;
    union_cardinality -=
        bitset_lenrange_cardinality(bitset->words, min, max - min);
    bitset_set_lenrange(bitset->words, min, max - min);
    bitset->cardinality = union_cardinality;
    if (bitset->cardinality <= DEFAULT_MAX_SIZE) {
        // we need to convert to an array container
        array_container_t *array = array_container_from_bitset(bitset);
        *typecode_after = ARRAY_CONTAINER_TYPE;
        bitset_container_free(bitset);
        return array;
    }
    return bitset;
}